

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O0

void slang::ast::Expression::selfDetermined(ASTContext *context,Expression **expr)

{
  Type *newType;
  Expression *pEVar1;
  undefined8 *in_RSI;
  ASTContext *in_RDI;
  PropagationVisitor visitor;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffff9c;
  SourceRange local_50;
  PropagationVisitor local_40;
  undefined8 *local_10;
  
  local_10 = in_RSI;
  newType = not_null<const_slang::ast::Type_*>::operator*
                      ((not_null<const_slang::ast::Type_*> *)0x60cadb);
  SourceRange::SourceRange((SourceRange *)in_RDI);
  uVar2 = 1;
  PropagationVisitor::PropagationVisitor
            (&local_40,in_RDI,newType,(Expression *)0x0,local_50,Propagated);
  pEVar1 = visit<slang::ast::Expression::PropagationVisitor&>
                     ((Expression *)in_RDI,
                      (PropagationVisitor *)CONCAT44(in_stack_ffffffffffffff9c,uVar2));
  *local_10 = pEVar1;
  return;
}

Assistant:

void Expression::selfDetermined(const ASTContext& context, Expression*& expr) {
    SLANG_ASSERT(expr->type);
    PropagationVisitor visitor(context, *expr->type, nullptr, {}, ConversionKind::Propagated);
    expr = &expr->visit(visitor);
}